

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O1

Value __thiscall xmrig::CpuThreads::toJSON(CpuThreads *this,Document *doc)

{
  SizeType SVar1;
  int iVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *pDVar3;
  uint uVar4;
  ulong uVar5;
  long in_RDX;
  long extraout_RDX;
  long extraout_RDX_00;
  CpuThread *thread;
  Document *doc_00;
  Value VVar6;
  Data local_58;
  Data local_48;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  *(undefined8 *)this = 0;
  this->m_affinity = 0;
  SVar1 = (doc->
          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ).data_.s.length;
  *(undefined8 *)this = 0;
  this->m_affinity = 0;
  if (SVar1 == 0) {
    *(undefined2 *)((long)&this->m_affinity + 6) = 4;
    pDVar3 = (Document *)doc->ownAllocator_;
    for (doc_00 = (Document *)doc->allocator_; doc_00 != pDVar3;
        doc_00 = (Document *)&doc_00->allocator_) {
      CpuThread::toJSON((CpuThread *)&local_58.s,doc_00);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_58.s,allocator);
      in_RDX = extraout_RDX;
    }
  }
  else {
    *(undefined2 *)((long)&this->m_affinity + 6) = 3;
    if (doc->allocator_ == doc->ownAllocator_) {
      uVar4 = 1;
    }
    else {
      iVar2 = (int)doc->allocator_->chunk_capacity_;
      uVar4 = iVar2 + (uint)(iVar2 == 0);
    }
    local_48.s.str = (Ch *)0x40500000018da8f;
    local_48.n = (Number)0x9;
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_58._0_4_ = uVar4;
    local_58.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_48.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_58.s,allocator);
    uVar5 = (long)doc->ownAllocator_ - (long)doc->allocator_;
    local_48.s.str = (Ch *)0x40500000018a29c;
    local_48.n = (Number)0x7;
    local_58.n = (Number)(uVar5 >> 4 & 0xffffffff);
    local_58.s.str = (Ch *)((ulong)((uVar5 >> 0x23 & 1) == 0) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_48.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_58.s,allocator);
    local_58.s.str = (Ch *)0x40500000018a26f;
    local_58.n = (Number)0x8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_58.s,
                    (long)(doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.s.str,allocator);
    in_RDX = extraout_RDX_00;
  }
  VVar6.data_.s.str = (Ch *)in_RDX;
  VVar6.data_.n = (Number)this;
  return (Value)VVar6.data_;
}

Assistant:

rapidjson::Value xmrig::CpuThreads::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out;

    if (m_format == ArrayFormat) {
        out.SetArray();

        for (const CpuThread &thread : m_data) {
            out.PushBack(thread.toJSON(doc), allocator);
        }
    }
    else {
        out.SetObject();

        out.AddMember(StringRef(kIntensity), m_data.empty() ? 1 : m_data.front().intensity(), allocator);
        out.AddMember(StringRef(kThreads), static_cast<unsigned>(m_data.size()), allocator);
        out.AddMember(StringRef(kAffinity), m_affinity, allocator);
    }

    return out;
}